

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Expression __thiscall cnn::expr::hinge(expr *this,Expression *x,uint *pindex,float m)

{
  ComputationGraph *arguments;
  undefined8 extraout_RDX;
  Expression EVar1;
  uint local_30;
  float local_2c;
  uint *local_28;
  uint *local_20;
  undefined8 local_18;
  
  arguments = x->pg;
  local_30 = (x->i).t;
  local_20 = &local_30;
  local_18 = 1;
  local_2c = m;
  local_28 = pindex;
  ComputationGraph::add_function<cnn::Hinge,unsigned_int_const*&,float&>
            ((ComputationGraph *)(this + 8),(initializer_list<cnn::VariableIndex> *)arguments,
             &local_20,(float *)&local_28);
  *(ComputationGraph **)this = arguments;
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = (ComputationGraph *)this;
  return EVar1;
}

Assistant:

Expression hinge(const Expression& x, const unsigned* pindex, float m) { return Expression(x.pg, x.pg->add_function<Hinge>({x.i}, pindex, m)); }